

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

string * __thiscall
t_dart_generator::dart_thrift_imports_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  t_program *ptVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  long *plVar11;
  pointer pptVar12;
  _Alloc_hider _Var13;
  string include_name;
  string named_import;
  string local_170;
  string *local_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_128,"import \'dart:typed_data\' show Uint8List;",&::endl_abi_cxx11_);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_128);
  paVar1 = &local_170.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_170.field_2._M_allocated_capacity = *psVar10;
    local_170.field_2._8_8_ = plVar8[3];
    local_170._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar10;
    local_170._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_170._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)::endl_abi_cxx11_._M_dataplus._M_p);
  paVar2 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    lVar6 = plVar8[3];
    paVar2->_M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  paVar3 = &local_128.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar3) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  local_60 = &this->package_prefix_;
  local_150 = __return_storage_ptr__;
  local_c8 = paVar2;
  if ((this->package_prefix_)._M_string_length == 0) {
    std::operator+(&local_e8,"import \'package:",&this->library_name_);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108.field_2._8_8_ = plVar8[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_108._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_108,(ulong)(this->library_name_)._M_dataplus._M_p);
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_138 = *plVar8;
      lStack_130 = puVar9[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar8;
      local_148 = (long *)*puVar9;
    }
    local_140 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128.field_2._8_8_ = puVar9[3];
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_128._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_128,(ulong)::endl_abi_cxx11_._M_dataplus._M_p);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_170.field_2._M_allocated_capacity = *psVar10;
      local_170.field_2._8_8_ = puVar9[3];
      local_170._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar10;
      local_170._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_170._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_170._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    pbVar7 = &local_e8;
  }
  else {
    std::operator+(&local_108,"import \'package:",local_60);
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_108,(ulong)(this->library_name_)._M_dataplus._M_p);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_138 = *plVar11;
      lStack_130 = plVar8[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar11;
      local_148 = (long *)*plVar8;
    }
    local_140 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128.field_2._8_8_ = plVar8[3];
      local_128._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_128._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_128,(ulong)::endl_abi_cxx11_._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_170.field_2._M_allocated_capacity = *psVar10;
      local_170.field_2._8_8_ = plVar8[3];
      local_170._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar10;
      local_170._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_170._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_170._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148);
    }
    pbVar7 = &local_108;
  }
  puVar4 = (undefined1 *)(&(pbVar7->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &pbVar7->field_2) {
    operator_delete(puVar4);
  }
  ptVar5 = (this->super_t_oop_generator).super_t_generator.program_;
  pptVar12 = (ptVar5->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_58 = (ptVar5->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (pptVar12 != local_58) {
    paVar1 = &local_108.field_2;
    do {
      find_library_name_abi_cxx11_(&local_170,this,*pptVar12);
      std::operator+(&local_128,"t_",&local_170);
      if ((this->package_prefix_)._M_string_length == 0) {
        std::operator+(&local_50,"import \'package:",&local_170);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_80.field_2._M_allocated_capacity = *psVar10;
          local_80.field_2._8_8_ = plVar8[3];
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar10;
          local_80._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_80._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_80,(ulong)local_170._M_dataplus._M_p);
        local_c0 = &local_b0;
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_b0 = *plVar8;
          lStack_a8 = puVar9[3];
        }
        else {
          local_b0 = *plVar8;
          local_c0 = (long *)*puVar9;
        }
        local_b8 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_a0 = &local_90;
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_90 = *plVar8;
          lStack_88 = puVar9[3];
        }
        else {
          local_90 = *plVar8;
          local_a0 = (long *)*puVar9;
        }
        local_98 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_a0,(ulong)local_128._M_dataplus._M_p);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_e8.field_2._M_allocated_capacity = *psVar10;
          local_e8.field_2._8_8_ = puVar9[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar10;
          local_e8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_e8._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_108.field_2._M_allocated_capacity = *psVar10;
          local_108.field_2._8_8_ = puVar9[3];
          local_108._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar10;
          local_108._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_108._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_108,(ulong)::endl_abi_cxx11_._M_dataplus._M_p);
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_138 = *plVar8;
          lStack_130 = puVar9[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *plVar8;
          local_148 = (long *)*puVar9;
        }
        local_140 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_150,(ulong)local_148);
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        pbVar7 = &local_50;
        _Var13._M_p = local_50._M_dataplus._M_p;
      }
      else {
        std::operator+(&local_80,"import \'package:",local_60);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_80,(ulong)local_170._M_dataplus._M_p);
        local_c0 = &local_b0;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_b0 = *plVar11;
          lStack_a8 = plVar8[3];
        }
        else {
          local_b0 = *plVar11;
          local_c0 = (long *)*plVar8;
        }
        local_b8 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_a0 = &local_90;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_90 = *plVar11;
          lStack_88 = plVar8[3];
        }
        else {
          local_90 = *plVar11;
          local_a0 = (long *)*plVar8;
        }
        local_98 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_a0,(ulong)local_128._M_dataplus._M_p);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_e8.field_2._M_allocated_capacity = *psVar10;
          local_e8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar10;
          local_e8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_108.field_2._M_allocated_capacity = *psVar10;
          local_108.field_2._8_8_ = puVar9[3];
          local_108._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar10;
          local_108._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_108._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_108,(ulong)::endl_abi_cxx11_._M_dataplus._M_p);
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_138 = *plVar8;
          lStack_130 = puVar9[3];
          local_148 = &local_138;
        }
        else {
          local_138 = *plVar8;
          local_148 = (long *)*puVar9;
        }
        local_140 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_150,(ulong)local_148);
        if (local_148 != &local_138) {
          operator_delete(local_148);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0);
        }
        pbVar7 = &local_80;
        _Var13._M_p = local_80._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &pbVar7->field_2) {
        operator_delete(_Var13._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      pptVar12 = pptVar12 + 1;
    } while (pptVar12 != local_58);
  }
  return local_150;
}

Assistant:

string t_dart_generator::dart_thrift_imports() {
  string imports = "import 'dart:typed_data' show Uint8List;" + endl +
                   "import 'package:thrift/thrift.dart';" + endl;

  // add import for this library
  if (package_prefix_.empty()) {
    imports += "import 'package:" + library_name_ + "/" + library_name_ + ".dart';" + endl;
  } else {
    imports += "import 'package:" + package_prefix_ + library_name_ + ".dart';" + endl;
  }

  // add imports for included thrift files
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    string include_name = find_library_name(include);
    string named_import = "t_" + include_name;
    if (package_prefix_.empty()) {
      imports += "import 'package:" + include_name + "/" + include_name + ".dart' as " + named_import + ";" + endl;
    } else {
      imports += "import 'package:" + package_prefix_ + include_name + ".dart' as " + named_import + ";" + endl;
    }
  }

  return imports;
}